

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void e2e_async_compact_pattern(int n_checkpoints,fdb_config fconfig,bool deletes,bool walflush)

{
  int iVar1;
  fdb_status fVar2;
  storage_t *st;
  int iVar3;
  bool bVar4;
  pthread_t tid;
  fdb_kvs_handle *snap_db;
  void *thread_ret;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info info;
  idx_prams_t index_params;
  checkpoint_t verification_checkpoint;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  memleak_start();
  rm_storage_fs();
  gen_index_params(&index_params);
  memset(&verification_checkpoint,0,0x430);
  st = init_storage(&fconfig,&fconfig,&kvs_config,&index_params,&verification_checkpoint,walflush);
  pthread_create(&tid,(pthread_attr_t *)0x0,compact_thread,&fconfig);
  iVar1 = 0;
  if (n_checkpoints < 1) {
    n_checkpoints = iVar1;
  }
  do {
    if (iVar1 == n_checkpoints) {
      pthread_join(tid,&thread_ret);
      e2e_fdb_shutdown(st);
      memleak_end();
      return;
    }
    load_persons(st);
    iVar3 = 100;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      load_persons(st);
      if (deletes) {
        delete_persons(st);
      }
      e2e_fdb_commit(st->main,walflush);
      fVar2 = fdb_get_kvs_info(st->all_docs,&info);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x254);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x254,"void e2e_async_compact_pattern(int, fdb_config, bool, bool)");
      }
      fVar2 = fdb_snapshot_open(st->all_docs,&snap_db,info.last_seqnum);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x256);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x256,"void e2e_async_compact_pattern(int, fdb_config, bool, bool)");
      }
      update_index(st,true);
      verify_db(st);
      fdb_kvs_close(snap_db);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void e2e_async_compact_pattern(int n_checkpoints, fdb_config fconfig,
                               bool deletes, bool walflush) {
    TEST_INIT();
    int n, i;
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_kvs_info info;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    thread_t tid;
    void *thread_ret;
    n_checkpoints = n_checkpoints * LOAD_FACTOR;

    memleak_start();

    // init
    rm_storage_fs();
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));

    // setup
    st = init_storage(&fconfig, &fconfig, &kvs_config,
            &index_params, &verification_checkpoint, walflush);

    // create compaction thread
    thread_create(&tid, compact_thread, (void*)&fconfig);

    // test
    for ( n = 0; n < n_checkpoints; ++n) {

#ifdef __DEBUG_E2E
        printf("checkpoint: %d\n", n);
#endif
        load_persons(st);
        for (i=0;i<100;++i) {
#ifdef __DEBUG_E2E
            printf("\n\n----%d----\n", i);
#endif
            load_persons(st);
            if (deletes) {
                delete_persons(st);
            }
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    thread_join(tid, &thread_ret);
    // teardown
    e2e_fdb_shutdown(st);

    memleak_end();
}